

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_init_userdefined(Curl_easy *data)

{
  undefined1 *puVar1;
  curl_sslbackend cVar2;
  CURLcode CVar3;
  
  (data->set).out = _stdout;
  (data->set).in_set = _stdin;
  (data->set).err = _stderr;
  (data->set).fwrite_func = fwrite;
  (data->set).fread_func_set = fread;
  (data->set).seek_client = (void *)0x0;
  (data->set).filesize = -1;
  (data->set).postfieldsize = -1;
  (data->set).maxredirs = 0x1e;
  (data->set).method = '\0';
  (data->set).rtspreq = RTSPREQ_OPTIONS;
  (data->set).ftp_filemethod = '\x01';
  (data->set).dns_cache_timeout = 0x3c;
  (data->set).httpauth = 1;
  (data->set).proxyport = 0;
  (data->set).proxytype = '\0';
  (data->set).socks5auth = '\x05';
  (data->set).general_ssl = 0x15180;
  (data->set).proxyauth = 1;
  *(ulong *)&(data->set).field_0x89c =
       *(ulong *)&(data->set).field_0x89c & 0xffffffffffd0ffef | 0x2b0000;
  Curl_mime_initpart(&(data->set).mimepost);
  Curl_ssl_easy_config_init(data);
  puVar1 = &(data->set).field_0x8a2;
  *puVar1 = *puVar1 | 0x18;
  (data->set).new_file_perms = 0x1a4;
  (data->set).allowed_protocols = 0xffffffff;
  (data->set).redir_protocols = 0xf;
  cVar2 = Curl_ssl_backend();
  if (((cVar2 == CURLSSLBACKEND_SCHANNEL) ||
      (cVar2 = Curl_ssl_backend(), cVar2 == CURLSSLBACKEND_SECURETRANSPORT)) ||
     ((CVar3 = Curl_setstropt((data->set).str + 6,"/etc/ssl/certs/ca-certificates.crt"),
      CVar3 == CURLE_OK &&
      (((CVar3 = Curl_setstropt((data->set).str + 0x13,"/etc/ssl/certs/ca-certificates.crt"),
        CVar3 == CURLE_OK &&
        (CVar3 = Curl_setstropt((data->set).str + 5,"/etc/ssl/certs"), CVar3 == CURLE_OK)) &&
       (CVar3 = Curl_setstropt((data->set).str + 0x12,"/etc/ssl/certs"), CVar3 == CURLE_OK)))))) {
    (data->set).chunk_bgn = (curl_chunk_bgn_callback)0x0;
    (data->set).chunk_end = (curl_chunk_end_callback)0x0;
    (data->set).fnmatch = (curl_fnmatch_callback)0x0;
    (data->set).tcp_keepidle = 0x3c;
    (data->set).tcp_keepintvl = 0x3c;
    (data->set).tcp_keepcnt = 9;
    (data->set).expect_100_timeout = 1000;
    (data->set).buffer_size = 0x4000;
    (data->set).upload_buffer_size = 0x10000;
    (data->set).happy_eyeballs_timeout = 200;
    (data->set).upkeep_interval_ms = 60000;
    (data->set).maxconnects = 5;
    (data->set).maxage_conn = 0x76;
    (data->set).maxlifetime_conn = 0;
    (data->set).httpwant = '\0';
    *(ulong *)&(data->set).field_0x89c =
         *(ulong *)&(data->set).field_0x89c & 0xfe3ff8fbffeffdbf | 0x40400000040;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_init_userdefined(struct Curl_easy *data)
{
  struct UserDefined *set = &data->set;
  CURLcode result = CURLE_OK;

  set->out = stdout; /* default output to stdout */
  set->in_set = stdin;  /* default input from stdin */
  set->err  = stderr;  /* default stderr to stderr */

  /* use fwrite as default function to store output */
  set->fwrite_func = (curl_write_callback)fwrite;

  /* use fread as default function to read input */
  set->fread_func_set = (curl_read_callback)fread;
  set->is_fread_set = 0;

  set->seek_client = ZERO_NULL;

  set->filesize = -1;        /* we do not know the size */
  set->postfieldsize = -1;   /* unknown size */
  set->maxredirs = 30;       /* sensible default */

  set->method = HTTPREQ_GET; /* Default HTTP request */
#ifndef CURL_DISABLE_RTSP
  set->rtspreq = RTSPREQ_OPTIONS; /* Default RTSP request */
#endif
#ifndef CURL_DISABLE_FTP
  set->ftp_use_epsv = TRUE;   /* FTP defaults to EPSV operations */
  set->ftp_use_eprt = TRUE;   /* FTP defaults to EPRT operations */
  set->ftp_use_pret = FALSE;  /* mainly useful for drftpd servers */
  set->ftp_filemethod = FTPFILE_MULTICWD;
  set->ftp_skip_ip = TRUE;    /* skip PASV IP by default */
#endif
  set->dns_cache_timeout = 60; /* Timeout every 60 seconds by default */

  /* Timeout every 24 hours by default */
  set->general_ssl.ca_cache_timeout = 24 * 60 * 60;

  set->httpauth = CURLAUTH_BASIC;  /* defaults to basic */

#ifndef CURL_DISABLE_PROXY
  set->proxyport = 0;
  set->proxytype = CURLPROXY_HTTP; /* defaults to HTTP proxy */
  set->proxyauth = CURLAUTH_BASIC; /* defaults to basic */
  /* SOCKS5 proxy auth defaults to username/password + GSS-API */
  set->socks5auth = CURLAUTH_BASIC | CURLAUTH_GSSAPI;
#endif

  /* make libcurl quiet by default: */
  set->hide_progress = TRUE;  /* CURLOPT_NOPROGRESS changes these */

  Curl_mime_initpart(&set->mimepost);

  Curl_ssl_easy_config_init(data);
#ifndef CURL_DISABLE_DOH
  set->doh_verifyhost = TRUE;
  set->doh_verifypeer = TRUE;
#endif
#ifdef USE_SSH
  /* defaults to any auth type */
  set->ssh_auth_types = CURLSSH_AUTH_DEFAULT;
  set->new_directory_perms = 0755; /* Default permissions */
#endif

  set->new_file_perms = 0644;    /* Default permissions */
  set->allowed_protocols = (curl_prot_t) CURLPROTO_ALL;
  set->redir_protocols = CURLPROTO_REDIR;

#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  /*
   * disallow unprotected protection negotiation NEC reference implementation
   * seem not to follow rfc1961 section 4.3/4.4
   */
  set->socks5_gssapi_nec = FALSE;
#endif

  /* Set the default CA cert bundle/path detected/specified at build time.
   *
   * If Schannel or Secure Transport is the selected SSL backend then these
   * locations are ignored. We allow setting CA location for Schannel and
   * Secure Transport when explicitly specified by the user via
   *  CURLOPT_CAINFO / --cacert.
   */
  if(Curl_ssl_backend() != CURLSSLBACKEND_SCHANNEL &&
     Curl_ssl_backend() != CURLSSLBACKEND_SECURETRANSPORT) {
#ifdef CURL_CA_BUNDLE
    result = Curl_setstropt(&set->str[STRING_SSL_CAFILE], CURL_CA_BUNDLE);
    if(result)
      return result;
#ifndef CURL_DISABLE_PROXY
    result = Curl_setstropt(&set->str[STRING_SSL_CAFILE_PROXY],
                            CURL_CA_BUNDLE);
    if(result)
      return result;
#endif
#endif
#ifdef CURL_CA_PATH
    result = Curl_setstropt(&set->str[STRING_SSL_CAPATH], CURL_CA_PATH);
    if(result)
      return result;
#ifndef CURL_DISABLE_PROXY
    result = Curl_setstropt(&set->str[STRING_SSL_CAPATH_PROXY], CURL_CA_PATH);
    if(result)
      return result;
#endif
#endif
  }

#ifndef CURL_DISABLE_FTP
  set->wildcard_enabled = FALSE;
  set->chunk_bgn      = ZERO_NULL;
  set->chunk_end      = ZERO_NULL;
  set->fnmatch = ZERO_NULL;
#endif
  set->tcp_keepalive = FALSE;
  set->tcp_keepintvl = 60;
  set->tcp_keepidle = 60;
  set->tcp_keepcnt = 9;
  set->tcp_fastopen = FALSE;
  set->tcp_nodelay = TRUE;
  set->ssl_enable_alpn = TRUE;
  set->expect_100_timeout = 1000L; /* Wait for a second by default. */
  set->sep_headers = TRUE; /* separated header lists by default */
  set->buffer_size = READBUFFER_SIZE;
  set->upload_buffer_size = UPLOADBUFFER_DEFAULT;
  set->happy_eyeballs_timeout = CURL_HET_DEFAULT;
  set->upkeep_interval_ms = CURL_UPKEEP_INTERVAL_DEFAULT;
  set->maxconnects = DEFAULT_CONNCACHE_SIZE; /* for easy handles */
  set->maxage_conn = 118;
  set->maxlifetime_conn = 0;
  set->http09_allowed = FALSE;
  set->httpwant = CURL_HTTP_VERSION_NONE
    ;
#if defined(USE_HTTP2) || defined(USE_HTTP3)
  memset(&set->priority, 0, sizeof(set->priority));
#endif
  set->quick_exit = 0L;
#ifndef CURL_DISABLE_WEBSOCKETS
  set->ws_raw_mode = FALSE;
  set->ws_no_auto_pong = FALSE;
#endif

  return result;
}